

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O3

int test_is_at(int index,...)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int local_b8 [14];
  va_list arg;
  
  piVar4 = (int *)&stack0x00000008;
  piVar5 = test_index;
  if ((index != 0) && (test_index[0] == index)) {
    uVar2 = 8;
    piVar3 = test_index;
    do {
      if ((uint)uVar2 < 0x29) {
        piVar5 = (int *)((long)local_b8 + uVar2);
        uVar2 = (ulong)((uint)uVar2 + 8);
      }
      else {
        piVar5 = piVar4;
        piVar4 = piVar4 + 2;
      }
      index = *piVar5;
      piVar5 = piVar3 + 1;
    } while ((index != 0) && (piVar1 = piVar3 + 1, piVar3 = piVar5, index == *piVar1));
  }
  return (int)(index == 0 && *piVar5 == 0);
}

Assistant:

int test_is_at(int index, ...)
{
    va_list arg;
    va_start(arg, index);
    size_t level;

    for (level = 0; index == test_index[level] && index != 0; ++level)
        index = va_arg(arg, int);

    va_end(arg);
    return index == test_index[level] && index == 0;
}